

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O1

int secp256k1_musig_nonce_agg
              (secp256k1_context *ctx,secp256k1_musig_aggnonce *aggnonce,
              secp256k1_musig_pubnonce **pubnonces,size_t n_pubnonces)

{
  int iVar1;
  secp256k1_ge *r;
  long lVar2;
  secp256k1_gej aggnonce_ptsj [2];
  secp256k1_ge aggnonce_pts [2];
  secp256k1_gej asStack_218 [2];
  secp256k1_ge local_e8 [2];
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_musig_nonce_agg_cold_2();
  }
  else if (((aggnonce != (secp256k1_musig_aggnonce *)0x0) &&
           (pubnonces != (secp256k1_musig_pubnonce **)0x0)) && (n_pubnonces != 0)) {
    iVar1 = secp256k1_musig_sum_pubnonces(ctx,asStack_218,pubnonces,n_pubnonces);
    if (iVar1 == 0) {
      return 0;
    }
    r = local_e8;
    secp256k1_ge_set_all_gej_var(r,asStack_218,2);
    aggnonce->data[0] = 0xa8;
    aggnonce->data[1] = 0xb7;
    aggnonce->data[2] = 0xe4;
    aggnonce->data[3] = 'g';
    lVar2 = 0;
    do {
      secp256k1_ge_to_bytes_ext(aggnonce->data + lVar2 + 4,r);
      lVar2 = lVar2 + 0x40;
      r = r + 1;
    } while (lVar2 == 0x40);
    return 1;
  }
  secp256k1_musig_nonce_agg_cold_1();
  return 0;
}

Assistant:

int secp256k1_musig_nonce_agg(const secp256k1_context* ctx, secp256k1_musig_aggnonce  *aggnonce, const secp256k1_musig_pubnonce * const* pubnonces, size_t n_pubnonces) {
    secp256k1_gej aggnonce_ptsj[2];
    secp256k1_ge aggnonce_pts[2];
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(aggnonce != NULL);
    ARG_CHECK(pubnonces != NULL);
    ARG_CHECK(n_pubnonces > 0);

    if (!secp256k1_musig_sum_pubnonces(ctx, aggnonce_ptsj, pubnonces, n_pubnonces)) {
        return 0;
    }
    secp256k1_ge_set_all_gej_var(aggnonce_pts, aggnonce_ptsj, 2);
    secp256k1_musig_aggnonce_save(aggnonce, aggnonce_pts);
    return 1;
}